

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramPipelineStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ActiveProgramCase::iterate(ActiveProgramCase *this)

{
  RenderContext *pRVar1;
  TestLog *pTVar2;
  int iVar3;
  GLenum GVar4;
  ProgramSources *pPVar5;
  undefined4 extraout_var;
  TestError *this_00;
  allocator<char> local_30a;
  allocator<char> local_309;
  ScopedLogSection section;
  undefined1 local_300 [40];
  string local_2d8;
  CallLogWrapper gl;
  ProgramPipeline pipeline;
  ResultCollector result;
  ShaderProgram frgProgram;
  ShaderProgram vtxProgram;
  
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&frgProgram,0,0xac);
  frgProgram.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  frgProgram.m_program.m_info.infoLog.field_2._8_8_ = 0;
  frgProgram.m_program.m_info.linkOk = false;
  frgProgram.m_program.m_info._33_7_ = 0;
  frgProgram.m_program.m_info.linkTimeUs._0_1_ = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_300,
             "#version 310 es\nout highp vec4 v_color;\nvoid main()\n{\n\tgl_Position = vec4(float(gl_VertexID) * 0.5, float(gl_VertexID+1) * 0.5, 0.0, 1.0);\n\tv_color = vec4(float(gl_VertexID), 1.0, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)&local_2d8);
  glu::VertexSource::VertexSource((VertexSource *)&result,(string *)local_300);
  pPVar5 = glu::ProgramSources::operator<<((ProgramSources *)&frgProgram,(ShaderSource *)&result);
  glu::ShaderProgram::ShaderProgram(&vtxProgram,pRVar1,pPVar5);
  std::__cxx11::string::~string((string *)&result.m_prefix);
  std::__cxx11::string::~string((string *)local_300);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&frgProgram);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&result,0,0xac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,
             "#version 310 es\nin highp vec4 v_color;\nlayout(location=0) out highp vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,(allocator<char> *)&gl);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_300,&local_2d8);
  pPVar5 = glu::ProgramSources::operator<<((ProgramSources *)&result,(ShaderSource *)local_300);
  glu::ShaderProgram::ShaderProgram(&frgProgram,pRVar1,pPVar5);
  std::__cxx11::string::~string((string *)(local_300 + 8));
  std::__cxx11::string::~string((string *)&local_2d8);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&result);
  glu::ProgramPipeline::ProgramPipeline(&pipeline,((this->super_TestCase).m_context)->m_renderCtx);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_300," // ERROR: ",(allocator<char> *)&local_2d8);
  tcu::ResultCollector::ResultCollector(&result,pTVar2,(string *)local_300);
  std::__cxx11::string::~string((string *)local_300);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_300,"VtxProg",&local_309);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"Vertex program",&local_30a);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_300,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)local_300);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &vtxProgram);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_300,"FrgProg",&local_309);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"Fragment program",&local_30a);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_300,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)local_300);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  &frgProgram);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  if ((vtxProgram.m_program.m_info.linkOk == true) && (frgProgram.m_program.m_info.linkOk != false))
  {
    gl.m_enableLog = true;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    glu::CallLogWrapper::glBindProgramPipeline(&gl,pipeline.m_pipeline);
    glu::CallLogWrapper::glUseProgramStages
              (&gl,pipeline.m_pipeline,1,vtxProgram.m_program.m_program);
    glu::CallLogWrapper::glUseProgramStages
              (&gl,pipeline.m_pipeline,2,frgProgram.m_program.m_program);
    GVar4 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar4,"gen pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x7d);
    glu::CallLogWrapper::glBindProgramPipeline(&gl,0);
    GVar4 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar4,"unbind pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x7f);
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_300,"Initial",&local_309);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"Initial",&local_30a);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_300,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)local_300);
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              (&result,&gl,pipeline.m_pipeline,0x8259,0,this->m_verifier);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_300,"Set",&local_309);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"Set",&local_30a);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_300,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)local_300);
    glu::CallLogWrapper::glActiveShaderProgram
              (&gl,pipeline.m_pipeline,frgProgram.m_program.m_program);
    GVar4 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar4,"gen pipeline",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramPipelineStateQueryTests.cpp"
                    ,0x8a);
    deqp::gls::StateQueryUtil::verifyStatePipelineInteger
              (&result,&gl,pipeline.m_pipeline,0x8259,frgProgram.m_program.m_program,
               this->m_verifier);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    tcu::ResultCollector::setTestContextResult
              (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::ResultCollector::~ResultCollector(&result);
    glu::CallLogWrapper::~CallLogWrapper(&gl);
    glu::ProgramPipeline::~ProgramPipeline(&pipeline);
    glu::ShaderProgram::~ShaderProgram(&frgProgram);
    glu::ShaderProgram::~ShaderProgram(&vtxProgram);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_300,"failed to build program",(allocator<char> *)&local_2d8);
  tcu::TestError::TestError(this_00,(string *)local_300);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ActiveProgramCase::IterateResult ActiveProgramCase::iterate (void)
{
	const glu::ShaderProgram	vtxProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::VertexSource(s_vertexSource));
	const glu::ShaderProgram	frgProgram	(m_context.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << glu::FragmentSource(s_fragmentSource));
	const glu::ProgramPipeline	pipeline	(m_context.getRenderContext());
	glu::CallLogWrapper			gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result		(m_testCtx.getLog(), " // ERROR: ");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "VtxProg", "Vertex program");
		m_testCtx.getLog() << vtxProgram;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "FrgProg", "Fragment program");
		m_testCtx.getLog() << frgProgram;
	}

	if (!vtxProgram.isOk() || !frgProgram.isOk())
		throw tcu::TestError("failed to build program");

	gl.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	gl.glBindProgramPipeline(pipeline.getPipeline());
	gl.glUseProgramStages(pipeline.getPipeline(), GL_VERTEX_SHADER_BIT, vtxProgram.getProgram());
	gl.glUseProgramStages(pipeline.getPipeline(), GL_FRAGMENT_SHADER_BIT, frgProgram.getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");
	gl.glBindProgramPipeline(0);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "unbind pipeline");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), GL_ACTIVE_PROGRAM, 0, m_verifier);
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Set", "Set");

		gl.glActiveShaderProgram(pipeline.getPipeline(), frgProgram.getProgram());
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen pipeline");
		verifyStatePipelineInteger(result, gl, pipeline.getPipeline(), GL_ACTIVE_PROGRAM, (int)frgProgram.getProgram(), m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}